

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O0

convertible_to_iterator __thiscall
ska::detailv3::
sherwood_v3_table<const_slang::ast::InstanceBodySymbol_*,_const_slang::ast::InstanceBodySymbol_*,_slang::Hasher<const_slang::ast::InstanceBodySymbol_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::ast::InstanceBodySymbol_*>_>,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>_>,_std::allocator<const_slang::ast::InstanceBodySymbol_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::InstanceBodySymbol_*>_>_>
::erase(sherwood_v3_table<const_slang::ast::InstanceBodySymbol_*,_const_slang::ast::InstanceBodySymbol_*,_slang::Hasher<const_slang::ast::InstanceBodySymbol_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::ast::InstanceBodySymbol_*>_>,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>_>,_std::allocator<const_slang::ast::InstanceBodySymbol_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::InstanceBodySymbol_*>_>_>
        *this,const_iterator to_erase)

{
  bool bVar1;
  sherwood_v3_entry<const_slang::ast::InstanceBodySymbol_*> *local_30;
  EntryPointer next;
  EntryPointer current;
  sherwood_v3_table<const_slang::ast::InstanceBodySymbol_*,_const_slang::ast::InstanceBodySymbol_*,_slang::Hasher<const_slang::ast::InstanceBodySymbol_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::ast::InstanceBodySymbol_*>_>,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>_>,_std::allocator<const_slang::ast::InstanceBodySymbol_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::InstanceBodySymbol_*>_>_>
  *this_local;
  const_iterator to_erase_local;
  
  sherwood_v3_entry<const_slang::ast::InstanceBodySymbol_*>::destroy_value(to_erase.current);
  this->num_elements = this->num_elements - 1;
  local_30 = to_erase.current + 1;
  next = to_erase.current;
  while( true ) {
    bVar1 = sherwood_v3_entry<const_slang::ast::InstanceBodySymbol_*>::is_at_desired_position
                      (local_30);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    sherwood_v3_entry<slang::ast::InstanceBodySymbol_const*>::
    emplace<slang::ast::InstanceBodySymbol_const*>
              ((sherwood_v3_entry<slang::ast::InstanceBodySymbol_const*> *)next,
               local_30->distance_from_desired + -1,&(local_30->field_1).value);
    sherwood_v3_entry<const_slang::ast::InstanceBodySymbol_*>::destroy_value(local_30);
    next = next + 1;
    local_30 = local_30 + 1;
  }
  return (convertible_to_iterator)to_erase.current;
}

Assistant:

convertible_to_iterator erase(const_iterator to_erase)
    {
        EntryPointer current = to_erase.current;
        current->destroy_value();
        --num_elements;
        for (EntryPointer next = current + ptrdiff_t(1); !next->is_at_desired_position(); ++current, ++next)
        {
            current->emplace(next->distance_from_desired - 1, std::move(next->value));
            next->destroy_value();
        }
        return { to_erase.current };
    }